

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetRetimeForward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iVar1;
  int iFlop_00;
  int iFlop;
  int iObj;
  int i;
  Vec_Int_t *vSet_local;
  Wln_Ret_t *p_local;
  
  for (iFlop = 0; iVar1 = Vec_IntSize(vSet), iFlop < iVar1; iFlop = iFlop + 1) {
    iVar1 = Vec_IntEntry(vSet,iFlop);
    iFlop_00 = Wln_RetRemoveOneFanin(p,iVar1);
    if (iFlop_00 != -1) {
      Wln_RetInsertOneFanout(p,iVar1,iFlop_00);
    }
  }
  return;
}

Assistant:

void Wln_RetRetimeForward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj, iFlop;
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        iFlop = Wln_RetRemoveOneFanin( p, iObj );
        if ( iFlop == -1 )
            continue;
        Wln_RetInsertOneFanout( p, iObj, iFlop );
    }
}